

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall libserver::server::_display_message(server *this,string *_display_msg)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->client_name);
  poVar1 = std::operator<<(poVar1," : ");
  poVar1 = std::operator<<(poVar1,(string *)_display_msg);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void libserver::server::_display_message(const std::string& _display_msg)
{
    // Display a nice formatted message
    std::cout<<client_name<<" : "<<_display_msg<<std::endl;
}